

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

String testing::internal::UnitTestOptions::GetAbsolutePathToOutputFile(void)

{
  char *pcVar1;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t sVar2;
  String *in_RDI;
  String *this;
  String SVar3;
  String SStack_58;
  FilePath result;
  FilePath output_name;
  String local_28;
  
  if (FLAGS_gtest_output == (char *)0x0) {
    String::String(in_RDI,"");
    sVar2 = extraout_RDX;
  }
  else {
    pcVar1 = strchr(FLAGS_gtest_output,0x3a);
    if (pcVar1 == (char *)0x0) {
      UnitTest::GetInstance();
      FilePath::FilePath(&result,((UnitTest::GetInstance::instance.impl_)->original_working_dir_).
                                 pathname_.c_str_);
      FilePath::FilePath((FilePath *)&SStack_58,"test_detail.xml");
      FilePath::ConcatPaths(&output_name,&result,(FilePath *)&SStack_58);
      String::String(in_RDI,&output_name.pathname_);
      String::~String(&output_name.pathname_);
      String::~String(&SStack_58);
      this = &result.pathname_;
    }
    else {
      FilePath::FilePath(&output_name,pcVar1 + 1);
      if (*output_name.pathname_.c_str_ != '/') {
        UnitTest::GetInstance();
        FilePath::FilePath((FilePath *)&SStack_58,
                           ((UnitTest::GetInstance::instance.impl_)->original_working_dir_).
                           pathname_.c_str_);
        FilePath::FilePath((FilePath *)&local_28,pcVar1 + 1);
        FilePath::ConcatPaths(&result,(FilePath *)&SStack_58,(FilePath *)&local_28);
        String::operator=(&output_name.pathname_,&result.pathname_);
        String::~String(&result.pathname_);
        String::~String(&local_28);
        String::~String(&SStack_58);
      }
      if ((output_name.pathname_.c_str_ == (char *)0x0 || output_name.pathname_.length_ != 0) &&
         (output_name.pathname_.c_str_[output_name.pathname_.length_ - 1] == '/')) {
        GetCurrentExecutableName();
        GetOutputFormat();
        FilePath::GenerateUniqueFileName
                  (&result,&output_name,(FilePath *)&SStack_58,local_28.c_str_);
        String::~String(&local_28);
        String::~String(&SStack_58);
        String::String(in_RDI,&result.pathname_);
        String::~String(&result.pathname_);
      }
      else {
        String::String(in_RDI,&output_name.pathname_);
      }
      this = &output_name.pathname_;
    }
    String::~String(this);
    sVar2 = extraout_RDX_00;
  }
  SVar3.length_ = sVar2;
  SVar3.c_str_ = (char *)in_RDI;
  return SVar3;
}

Assistant:

String UnitTestOptions::GetAbsolutePathToOutputFile() {
  const char* const gtest_output_flag = GTEST_FLAG(output).c_str();
  if (gtest_output_flag == NULL)
    return String("");

  const char* const colon = strchr(gtest_output_flag, ':');
  if (colon == NULL)
    return String(internal::FilePath::ConcatPaths(
               internal::FilePath(
                   UnitTest::GetInstance()->original_working_dir()),
               internal::FilePath(kDefaultOutputFile)).ToString() );

  internal::FilePath output_name(colon + 1);
  if (!output_name.IsAbsolutePath())
    // TODO(wan@google.com): on Windows \some\path is not an absolute
    // path (as its meaning depends on the current drive), yet the
    // following logic for turning it into an absolute path is wrong.
    // Fix it.
    output_name = internal::FilePath::ConcatPaths(
        internal::FilePath(UnitTest::GetInstance()->original_working_dir()),
        internal::FilePath(colon + 1));

  if (!output_name.IsDirectory())
    return output_name.ToString();

  internal::FilePath result(internal::FilePath::GenerateUniqueFileName(
      output_name, internal::GetCurrentExecutableName(),
      GetOutputFormat().c_str()));
  return result.ToString();
}